

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng_test.cpp
# Opt level: O0

void __thiscall RNG_OperatorMinus_Test::RNG_OperatorMinus_Test(RNG_OperatorMinus_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__RNG_OperatorMinus_Test_03956578;
  return;
}

Assistant:

TEST(RNG, OperatorMinus) {
    RNG ra(1337), rb(1337);
    RNG rng;
    for (int i = 0; i < 10; ++i) {
        int step = 1 + rng.Uniform<uint32_t>(1000);
        for (int j = 0; j < step; ++j)
            (void)ra.Uniform<uint32_t>();
        EXPECT_EQ(step, ra - rb);
        EXPECT_EQ(-step, rb - ra);

        // Reysnchronize them
        if ((rng.Uniform<uint32_t>() & 1) != 0u)
            rb.Advance(step);
        else
            ra.Advance(-step);
        EXPECT_EQ(0, ra - rb);
        EXPECT_EQ(0, rb - ra);
    }
}